

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpSWU(word *b,word *a,ec_o *ec,void *stack)

{
  size_t n_00;
  bool_t bVar1;
  word *pwVar2;
  word *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  word *in_RDI;
  word *s;
  word *y;
  word *x2;
  word *x1;
  word *t;
  size_t mask;
  size_t n;
  word *b_00;
  word *mod;
  word *a_00;
  word *b_01;
  
  n_00 = *(size_t *)(*(long *)(in_RDX + 0x18) + 0x30);
  b_01 = in_RCX + n_00;
  a_00 = b_01 + n_00;
  mod = a_00 + n_00;
  b_00 = mod + n_00;
  pwVar2 = b_00 + n_00;
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))
            (in_RCX,in_RSI,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzNegMod(b_01,a_00,mod,(size_t)b_00);
  wwCopy(b_00,*(word **)(*(long *)(in_RDX + 0x18) + 0x18),n_00);
  zzSubW2(b_00,n_00,2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))(a_00,in_RCX,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x50))(a_00,a_00,in_RCX,*(undefined8 *)(in_RDX + 0x18));
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (b_01,a_00,*(undefined8 *)(in_RDX + 0x20),*(undefined8 *)(in_RDX + 0x18),pwVar2);
  qrPower(t,x1,x2,(size_t)y,(qr_o *)s,in_RDI);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x50))
            (a_00,a_00,*(undefined8 *)(*(long *)(in_RDX + 0x18) + 0x20),
             *(undefined8 *)(in_RDX + 0x18));
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (b_01,b_01,a_00,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (b_01,b_01,*(undefined8 *)(in_RDX + 0x28),*(undefined8 *)(in_RDX + 0x18),pwVar2);
  zzNegMod(b_01,a_00,mod,(size_t)b_00);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))(a_00,b_01,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (a_00,a_00,b_01,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (mod,b_01,*(undefined8 *)(in_RDX + 0x20),*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x50))(mod,mod,a_00,*(undefined8 *)(in_RDX + 0x18));
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x50))
            (mod,mod,*(undefined8 *)(in_RDX + 0x28),*(undefined8 *)(in_RDX + 0x18));
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (a_00,b_01,in_RCX,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  wwCopy(in_RCX,*(word **)(*(long *)(in_RDX + 0x18) + 0x18),n_00);
  wwShLo(b_01,(size_t)a_00,(size_t)mod);
  zzSub(b_00,b_00,in_RCX,n_00);
  qrPower(t,x1,x2,(size_t)y,(qr_o *)s,in_RDI);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))(b_00,in_RSI,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (b_00,b_00,in_RSI,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (b_00,b_00,mod,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))
            (in_RDI,in_RCX,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (in_RDI,in_RDI,mod,*(undefined8 *)(in_RDX + 0x18),pwVar2);
  bVar1 = wwEq(in_RDI,*(word **)(*(long *)(in_RDX + 0x18) + 0x20),
               *(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  wwCopy(in_RDI,b_01 + ((long)bVar1 - 1U & n_00),*(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
            (in_RDI + n_00,in_RCX,mod + ((long)bVar1 - 1U & n_00),*(undefined8 *)(in_RDX + 0x18),
             pwVar2);
  return;
}

Assistant:

void ecpSWU(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	register size_t mask;
	// переменные в stack [x2 после x1, s после y!]
	word* t = (word*)stack;
	word* x1 = t + n;
	word* x2 = x1 + n;
	word* y = x2 + n;
	word* s = y + n; 
	stack = s + n;
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(zmIsIn(a, ec->f));
	ASSERT(wwGetBits(ec->f->mod, 0, 2) == 3);
	ASSERT(!qrIsZero(ec->A, ec->f) && !qrIsZero(ec->B, ec->f));
	// t <- -a^2
	qrSqr(t, a, ec->f, stack);
	zmNeg(t, t, ec->f);
	// s <- p - 2
	wwCopy(s, ec->f->mod, n);
	zzSubW2(s, n, 2);
	// x1 <- -B(1 + t + t^2)(A(t + t^2))^{p - 2} 
	qrSqr(x2, t, ec->f, stack);
	qrAdd(x2, x2, t, ec->f);
	qrMul(x1, x2, ec->A, ec->f, stack);
	qrPower(x1, x1, s, n, ec->f, stack);
	qrAddUnity(x2, x2, ec->f);
	qrMul(x1, x1, x2, ec->f, stack);
	qrMul(x1, x1, ec->B, ec->f, stack);
	zmNeg(x1, x1, ec->f);
	// y <- (x1)^3 + A x1 + B
	qrSqr(x2, x1, ec->f, stack);
	qrMul(x2, x2, x1, ec->f, stack);
	qrMul(y, x1, ec->A, ec->f, stack);
	qrAdd(y, y, x2, ec->f);
	qrAdd(y, y, ec->B, ec->f);
	// x2 <- x1 t
	qrMul(x2, x1, t, ec->f, stack);
	// t <- y^{(p - 1) - (p + 1) / 4} = y^{s - (p - 3) / 4}
	wwCopy(t, ec->f->mod, n);
	wwShLo(t, n, 2);
	zzSub(s, s, t, n);
	qrPower(t, y, s, n, ec->f, stack);
	// s <- a^3 y
	qrSqr(s, a, ec->f, stack);
	qrMul(s, s, a, ec->f, stack);
	qrMul(s, s, y, ec->f, stack);
	// mask <- t^2 y == 1 ? 0 : -1;
	qrSqr(b, t, ec->f, stack);
	qrMul(b, b, y, ec->f, stack);
	mask = qrIsUnity(b, ec->f) - SIZE_1;
	// b <- mask == 0 ? (x1, t y) : (x2, t s)
	qrCopy(ecX(b), x1 + (mask & n), ec->f);
	qrMul(ecY(b, n), t, y + (mask & n), ec->f, stack);
	// очистка
	mask = 0;
}